

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.cpp
# Opt level: O2

bool __thiscall duckdb::Expression::PropagatesNullValues(Expression *this)

{
  ExpressionType EVar1;
  bool propagate_null_values;
  undefined1 local_29;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  EVar1 = (this->super_BaseExpression).type;
  if (((0x33 < (ulong)EVar1) || (local_29 = 0, (0xc01200000c000U >> ((ulong)EVar1 & 0x3f) & 1) == 0)
      ) && (local_29 = 0, EVar1 != OPERATOR_COALESCE)) {
    local_28._M_unused._M_object = &local_29;
    local_29 = 1;
    local_28._8_8_ = 0;
    local_10 = ::std::
               _Function_handler<void_(const_duckdb::Expression_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/expression.cpp:75:47)>
               ::_M_invoke;
    local_18 = ::std::
               _Function_handler<void_(const_duckdb::Expression_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/expression.cpp:75:47)>
               ::_M_manager;
    ExpressionIterator::EnumerateChildren
              (this,(function<void_(const_duckdb::Expression_&)> *)&local_28);
    ::std::_Function_base::~_Function_base((_Function_base *)&local_28);
  }
  return (bool)local_29;
}

Assistant:

bool Expression::PropagatesNullValues() const {
	if (type == ExpressionType::OPERATOR_IS_NULL || type == ExpressionType::OPERATOR_IS_NOT_NULL ||
	    type == ExpressionType::COMPARE_NOT_DISTINCT_FROM || type == ExpressionType::COMPARE_DISTINCT_FROM ||
	    type == ExpressionType::CONJUNCTION_OR || type == ExpressionType::CONJUNCTION_AND ||
	    type == ExpressionType::OPERATOR_COALESCE) {
		return false;
	}
	bool propagate_null_values = true;
	ExpressionIterator::EnumerateChildren(*this, [&](const Expression &child) {
		if (!child.PropagatesNullValues()) {
			propagate_null_values = false;
		}
	});
	return propagate_null_values;
}